

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O2

char * blogc_render(bc_slist_t *tmpl,bc_slist_t *sources,bc_slist_t *listing_entries,
                   bc_trie_t *config,_Bool listing)

{
  void **ppvVar1;
  uint uVar2;
  bool bVar3;
  _bc_slist_t **pp_Var4;
  bool bVar5;
  int iVar6;
  bc_string_t *str;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  bc_trie_t *pbVar12;
  bool bVar13;
  bc_slist_t *l;
  _bc_slist_t *p_Var14;
  _bc_slist_t *foreach_var;
  int *piVar15;
  bc_slist_t *pbVar16;
  bc_trie_t *local_88;
  bc_slist_t *local_78;
  bc_slist_t *local_68;
  char *local_58;
  bc_slist_t *local_50;
  
  if (tmpl == (bc_slist_t *)0x0) {
    return (char *)0x0;
  }
  local_68 = (bc_slist_t *)0x0;
  str = bc_string_new();
  local_50 = (bc_slist_t *)0x0;
  local_88 = (bc_trie_t *)0x0;
  local_58 = (char *)0x0;
  foreach_var = (bc_slist_t *)0x0;
  l = (bc_slist_t *)0x0;
  pbVar16 = (bc_slist_t *)0x0;
  bVar3 = false;
  bVar5 = false;
  local_78 = listing_entries;
LAB_00103c1e:
  p_Var14 = tmpl;
  if (p_Var14 == (bc_slist_t *)0x0) {
    pcVar10 = bc_string_free(str,false);
    return pcVar10;
  }
  piVar15 = (int *)p_Var14->data;
  switch(*piVar15) {
  case 1:
  case 3:
    bVar13 = true;
    goto LAB_00103d4e;
  case 2:
    bVar13 = false;
LAB_00103d4e:
    if (*(char **)(piVar15 + 2) == (char *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pbVar12 = (bc_trie_t *)0x0;
      if (bVar3) {
        pbVar12 = local_88;
      }
      pcVar10 = blogc_format_variable(*(char **)(piVar15 + 2),config,pbVar12,local_58,foreach_var);
    }
    if (piVar15[1] == 0) {
      if (bVar13 == (pcVar10 == (char *)0x0)) goto LAB_00103f46;
LAB_001040ea:
      bVar5 = false;
    }
    else {
      pcVar8 = *(char **)(piVar15 + 4);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        sVar7 = strlen(pcVar8);
        if (((sVar7 < 2) || (*pcVar8 != '\"')) || (pcVar8[sVar7 - 1] != '\"')) {
          pbVar12 = (bc_trie_t *)0x0;
          if (bVar3) {
            pbVar12 = local_88;
          }
          pcVar8 = blogc_format_variable(pcVar8,config,pbVar12,local_58,foreach_var);
        }
        else {
          pcVar8 = bc_strndup(pcVar8 + 1,sVar7 - 2);
        }
        if ((pcVar10 != (char *)0x0) && (pcVar8 != (char *)0x0)) {
          iVar6 = strcmp(pcVar10,pcVar8);
          uVar2 = piVar15[1];
          if (iVar6 == 0) {
            uVar2 = uVar2 & 2;
joined_r0x001040dc:
            if (uVar2 == 0) goto LAB_00103f3e;
          }
          else if ((uVar2 & 1) == 0) {
            if (-1 < iVar6) {
              free(pcVar8);
              if ((uVar2 & 8) != 0) goto LAB_001040ea;
              goto LAB_00103f46;
            }
            uVar2 = uVar2 & 4;
            goto joined_r0x001040dc;
          }
          free(pcVar8);
          goto LAB_001040ea;
        }
      }
LAB_00103f3e:
      free(pcVar8);
LAB_00103f46:
      lVar9 = 0;
LAB_00103f4f:
      p_Var14 = p_Var14->next;
      iVar6 = *p_Var14->data;
      lVar11 = 1;
      if (iVar6 - 1U < 3) goto LAB_00103f89;
      if (iVar6 != 4 || lVar9 != 0) goto code_r0x00103f74;
      bVar5 = true;
    }
LAB_001040f2:
    free(pcVar10);
    break;
  case 4:
    if (!bVar5) {
      lVar9 = 0;
LAB_00103fa1:
      p_Var14 = p_Var14->next;
      lVar11 = 1;
      if (2 < *p_Var14->data - 1U) goto code_r0x00103fb4;
      goto LAB_00103fc9;
    }
  case 5:
switchD_00103c44_caseD_5:
    bVar5 = false;
    break;
  case 6:
    if (l == (bc_slist_t *)0x0) {
      if (*(char **)(piVar15 + 2) != (char *)0x0) {
        pbVar12 = (bc_trie_t *)0x0;
        if (bVar3) {
          pbVar12 = local_88;
        }
        l = blogc_split_list_variable(*(char **)(piVar15 + 2),config,pbVar12);
        if (l != (bc_slist_t *)0x0) {
          pcVar10 = *(char **)(piVar15 + 2);
          goto LAB_00104026;
        }
      }
      while (*piVar15 != 7) {
        p_Var14 = p_Var14->next;
        piVar15 = (int *)p_Var14->data;
      }
      l = (bc_slist_t *)0x0;
    }
    else if (foreach_var == (bc_slist_t *)0x0) {
      pcVar10 = *(char **)(piVar15 + 2);
LAB_00104026:
      local_58 = bc_strdup(pcVar10);
      foreach_var = l;
      pbVar16 = p_Var14;
    }
    break;
  case 7:
    if ((pbVar16 != (bc_slist_t *)0x0) && (foreach_var != (bc_slist_t *)0x0)) {
      foreach_var = foreach_var->next;
      tmpl = pbVar16;
      if (foreach_var != (_bc_slist_t *)0x0) goto LAB_00103c1e;
      foreach_var = (bc_slist_t *)0x0;
    }
    bc_slist_free_full(l,free);
    free(local_58);
    local_58 = (char *)0x0;
    l = (bc_slist_t *)0x0;
    pbVar16 = (bc_slist_t *)0x0;
    break;
  case 8:
    pcVar10 = *(char **)(piVar15 + 2);
    iVar6 = strcmp("entry",pcVar10);
    if (iVar6 == 0) {
      if (!listing) {
        if (sources == (bc_slist_t *)0x0) {
          local_68 = (bc_slist_t *)0x0;
          local_88 = (bc_trie_t *)0x0;
        }
        else {
          local_88 = (bc_trie_t *)sources->data;
          local_68 = sources;
        }
        goto LAB_00103cb3;
      }
      iVar6 = 8;
      while (iVar6 != 9) {
        p_Var14 = p_Var14->next;
        iVar6 = *p_Var14->data;
      }
    }
    else {
LAB_00103cb3:
      iVar6 = strcmp("listing_entry",pcVar10);
      if (iVar6 != 0) {
        iVar6 = strcmp("listing",pcVar10);
        if ((iVar6 == 0) || (iVar6 = strcmp("listing_empty",pcVar10), iVar6 == 0)) {
          if (!listing) goto LAB_00103d16;
        }
        else {
          iVar6 = strcmp("listing_once",pcVar10);
          if (iVar6 == 0 && !listing) {
LAB_00103d16:
            iVar6 = 8;
            while (iVar6 != 9) {
              p_Var14 = p_Var14->next;
              iVar6 = *p_Var14->data;
            }
            goto LAB_001041a0;
          }
        }
LAB_0010409f:
        iVar6 = strcmp("listing_empty",pcVar10);
        if ((sources == (bc_slist_t *)0x0) || (iVar6 != 0)) {
          iVar6 = strcmp("listing",pcVar10);
          bVar3 = true;
          if (iVar6 != 0) break;
          if (sources == (bc_slist_t *)0x0) {
            iVar6 = 8;
            while (iVar6 != 9) {
              p_Var14 = p_Var14->next;
              iVar6 = *p_Var14->data;
            }
          }
          else {
            if (local_68 == (bc_slist_t *)0x0) {
              local_50 = p_Var14;
              local_68 = sources;
            }
            local_88 = (bc_trie_t *)local_68->data;
          }
        }
        else {
          iVar6 = 8;
          while (iVar6 != 9) {
            p_Var14 = p_Var14->next;
            iVar6 = *p_Var14->data;
          }
        }
        bVar3 = true;
        break;
      }
      if (local_78 == (bc_slist_t *)0x0) {
        local_78 = (bc_slist_t *)0x0;
      }
      else {
        pp_Var4 = &local_78->next;
        ppvVar1 = &local_78->data;
        local_78 = *pp_Var4;
        if (listing && (bc_trie_t *)*ppvVar1 != (bc_trie_t *)0x0) {
          local_68 = (bc_slist_t *)0x0;
          local_88 = (bc_trie_t *)*ppvVar1;
          goto LAB_0010409f;
        }
      }
      iVar6 = 8;
      while (iVar6 != 9) {
        p_Var14 = p_Var14->next;
        iVar6 = *p_Var14->data;
      }
    }
LAB_001041a0:
    bVar3 = true;
    break;
  case 9:
    bVar3 = false;
    if ((local_50 == (bc_slist_t *)0x0) || (local_68 == (bc_slist_t *)0x0)) break;
    local_68 = local_68->next;
    bVar3 = false;
    tmpl = local_50;
    if (local_68 != (_bc_slist_t *)0x0) goto LAB_00103c1e;
    local_68 = (bc_slist_t *)0x0;
    local_50 = (bc_slist_t *)0x0;
    break;
  case 10:
    if (*(char **)(piVar15 + 2) != (char *)0x0) {
      pbVar12 = (bc_trie_t *)0x0;
      if (bVar3) {
        pbVar12 = local_88;
      }
      pcVar10 = blogc_format_variable(*(char **)(piVar15 + 2),config,pbVar12,local_58,foreach_var);
      if (pcVar10 != (char *)0x0) {
        bc_string_append(str,pcVar10);
        free(pcVar10);
      }
    }
    break;
  case 0xb:
    if (*(char **)(piVar15 + 2) != (char *)0x0) {
      bc_string_append(str,*(char **)(piVar15 + 2));
    }
  }
  tmpl = p_Var14->next;
  goto LAB_00103c1e;
code_r0x00103fb4:
  if (*p_Var14->data == 5) {
    lVar11 = -1;
    if (lVar9 != 0) {
LAB_00103fc9:
      lVar9 = lVar9 + lVar11;
      goto LAB_00103fa1;
    }
    goto switchD_00103c44_caseD_5;
  }
  goto LAB_00103fa1;
code_r0x00103f74:
  if (iVar6 == 5) {
    lVar11 = -1;
    if (lVar9 == 0) goto LAB_001040f2;
LAB_00103f89:
    lVar9 = lVar9 + lVar11;
  }
  goto LAB_00103f4f;
}

Assistant:

char*
blogc_render(bc_slist_t *tmpl, bc_slist_t *sources, bc_slist_t *listing_entries,
    bc_trie_t *config, bool listing)
{
    if (tmpl == NULL)
        return NULL;

    bc_slist_t *current_source = NULL;
    bc_slist_t *listing_start = NULL;

    bc_string_t *str = bc_string_new();

    bc_trie_t *tmp_source = NULL;
    char *config_value = NULL;
    char *defined = NULL;

    size_t if_count = 0;

    char *foreach_name = NULL;
    bc_slist_t *foreach_var = NULL;
    bc_slist_t *foreach_var_start = NULL;
    bc_slist_t *foreach_start = NULL;

    bool if_not = false;
    bool inside_block = false;
    bool evaluate = false;
    bool valid_else = false;

    int cmp = 0;

    bc_slist_t *tmp = tmpl;
    bc_slist_t *current_listing_entry = listing_entries;
    while (tmp != NULL) {
        blogc_template_node_t *node = tmp->data;

        switch (node->type) {

            case BLOGC_TEMPLATE_NODE_CONTENT:
                if (node->data[0] != NULL)
                    bc_string_append(str, node->data[0]);
                break;

            case BLOGC_TEMPLATE_NODE_BLOCK:
                inside_block = true;
                if_count = 0;
                if (0 == strcmp("entry", node->data[0])) {
                    if (listing) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                    current_source = sources;
                    tmp_source = current_source != NULL ? current_source->data : NULL;
                }
                if (0 == strcmp("listing_entry", node->data[0])) {
                    bc_trie_t *listing_entry = NULL;
                    if (current_listing_entry != NULL) {
                        listing_entry = current_listing_entry->data;
                        current_listing_entry = current_listing_entry->next;
                    }
                    if (listing_entry == NULL || !listing) {
                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                    current_source = NULL;
                    tmp_source = listing_entry;
                }
                else if ((0 == strcmp("listing", node->data[0])) ||
                         (0 == strcmp("listing_empty", node->data[0])) ||
                         (0 == strcmp("listing_once", node->data[0]))) {
                    if (!listing) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                }
                if (0 == strcmp("listing_empty", node->data[0])) {
                    if (sources != NULL) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                }
                if (0 == strcmp("listing", node->data[0])) {
                    if (sources == NULL) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                    if (current_source == NULL) {
                        listing_start = tmp;
                        current_source = sources;
                    }
                    tmp_source = current_source != NULL ? current_source->data : NULL;
                }
                break;

            case BLOGC_TEMPLATE_NODE_VARIABLE:
                if (node->data[0] != NULL) {
                    config_value = blogc_format_variable(node->data[0],
                        config, inside_block ? tmp_source : NULL, foreach_name, foreach_var);
                    if (config_value != NULL) {
                        bc_string_append(str, config_value);
                        free(config_value);
                        config_value = NULL;
                        break;
                    }
                }
                break;

            case BLOGC_TEMPLATE_NODE_ENDBLOCK:
                inside_block = false;
                if (listing_start != NULL && current_source != NULL) {
                    current_source = current_source->next;
                    if (current_source != NULL) {
                        tmp = listing_start;
                        continue;
                    }
                    else
                        listing_start = NULL;
                }
                break;

            case BLOGC_TEMPLATE_NODE_IFNDEF:
                if_not = true;

            case BLOGC_TEMPLATE_NODE_IF:
            case BLOGC_TEMPLATE_NODE_IFDEF:
                if_count = 0;
                defined = NULL;
                if (node->data[0] != NULL)
                    defined = blogc_format_variable(node->data[0], config,
                        inside_block ? tmp_source : NULL, foreach_name, foreach_var);
                evaluate = false;
                if (node->op != 0) {
                    // Strings that start with a '"' are actually strings, the
                    // others are meant to be looked up as a second variable
                    // check.
                    char *defined2 = NULL;
                    if (node->data[1] != NULL) {
                        if ((strlen(node->data[1]) >= 2) &&
                            (node->data[1][0] == '"') &&
                            (node->data[1][strlen(node->data[1]) - 1] == '"'))
                        {
                            defined2 = bc_strndup(node->data[1] + 1,
                                strlen(node->data[1]) - 2);
                        }
                        else {
                            defined2 = blogc_format_variable(node->data[1],
                                config, inside_block ? tmp_source : NULL,
                                foreach_name, foreach_var);
                        }
                    }

                    if (defined != NULL && defined2 != NULL) {
                        cmp = strcmp(defined, defined2);
                        if (cmp != 0 && node->op & BLOGC_TEMPLATE_OP_NEQ)
                            evaluate = true;
                        else if (cmp == 0 && node->op & BLOGC_TEMPLATE_OP_EQ)
                            evaluate = true;
                        else if (cmp < 0 && node->op & BLOGC_TEMPLATE_OP_LT)
                            evaluate = true;
                        else if (cmp > 0 && node->op & BLOGC_TEMPLATE_OP_GT)
                            evaluate = true;
                    }

                    free(defined2);
                }
                else {
                    if (if_not && defined == NULL)
                        evaluate = true;
                    if (!if_not && defined != NULL)
                        evaluate = true;
                }
                if (!evaluate) {

                    // at this point we can just skip anything, counting the
                    // number of 'if's, to know how many 'endif's we need to
                    // skip as well.
                    while (1) {
                        tmp = tmp->next;
                        node = tmp->data;
                        if ((node->type == BLOGC_TEMPLATE_NODE_IF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFDEF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFNDEF))
                        {
                            if_count++;
                            continue;
                        }
                        if ((node->type == BLOGC_TEMPLATE_NODE_ELSE) &&
                            (if_count == 0))
                        {
                            // this is somewhat complex. only an else statement
                            // right after a non evaluated block should be considered
                            // valid, because all the inner conditionals were just
                            // skipped, and all the outter conditionals evaluated
                            // to true.
                            valid_else = true;
                            break;
                        }
                        if (node->type == BLOGC_TEMPLATE_NODE_ENDIF) {
                            if (if_count > 0) {
                                if_count--;
                                continue;
                            }
                            break;
                        }
                    }
                }
                else {
                    valid_else = false;
                }
                free(defined);
                defined = NULL;
                if_not = false;
                break;

            case BLOGC_TEMPLATE_NODE_ELSE:
                if_count = 0;
                if (!valid_else) {

                    // at this point we can just skip anything, counting the
                    // number of 'if's, to know how many 'endif's we need to
                    // skip as well.
                    while (1) {
                        tmp = tmp->next;
                        node = tmp->data;
                        if ((node->type == BLOGC_TEMPLATE_NODE_IF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFDEF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFNDEF))
                        {
                            if_count++;
                            continue;
                        }
                        // no need to handle else statements here, because every
                        // if should have an endif.
                        if (node->type == BLOGC_TEMPLATE_NODE_ENDIF) {
                            if (if_count > 0) {
                                if_count--;
                                continue;
                            }
                            break;
                        }
                    }
                }
                valid_else = false;
                break;

            case BLOGC_TEMPLATE_NODE_ENDIF:
                // any endif statement should invalidate valid_else, to avoid
                // propagation to outter conditionals.
                valid_else = false;
                if (if_count > 0)
                    if_count--;
                break;

            case BLOGC_TEMPLATE_NODE_FOREACH:
                if (foreach_var_start == NULL) {
                    if (node->data[0] != NULL)
                        foreach_var_start = blogc_split_list_variable(node->data[0],
                            config, inside_block ? tmp_source : NULL);

                    if (foreach_var_start != NULL) {
                        foreach_name = bc_strdup(node->data[0]);
                        foreach_var = foreach_var_start;
                        foreach_start = tmp;
                    }
                    else {

                        // we can just skip anything and walk until the next
                        // 'endforeach'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDFOREACH) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                }

                if (foreach_var == NULL) {
                    foreach_start = tmp;
                    foreach_name = bc_strdup(node->data[0]);
                    foreach_var = foreach_var_start;
                }
                break;

            case BLOGC_TEMPLATE_NODE_ENDFOREACH:
                if (foreach_start != NULL && foreach_var != NULL) {
                    foreach_var = foreach_var->next;
                    if (foreach_var != NULL) {
                        tmp = foreach_start;
                        continue;
                    }
                }
                foreach_start = NULL;
                bc_slist_free_full(foreach_var_start, free);
                foreach_var_start = NULL;
                free(foreach_name);
                foreach_name = NULL;
                break;
        }
        tmp = tmp->next;
    }

    // no need to free temporary variables here. the template parser makes sure
    // that templates are sane and statements are closed.

    return bc_string_free(str, false);
}